

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O3

bool __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::find_nonatomic_impl_
          (HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,int *val)

{
  pointer pGVar1;
  _Alloc_hider _Var2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  size_t in_R8;
  ulong uVar7;
  bool bVar8;
  GlobalPtr<const_BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  src;
  remove_const_t<BCL::HashMapEntry<std::__cxx11::basic_string<char>,_int>_> rv;
  HME entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int *local_60;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
  local_58;
  ulong uStack_40;
  
  local_60 = val;
  sVar4 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this->field_0x18,key);
  local_58.ptr.rank = 0;
  local_58.ptr.ptr = 0;
  local_58.len = 0;
  uStack_40 = (ulong)(uint)uStack_40;
  uVar6 = this->capacity_;
  uVar5 = 0;
  do {
    while( true ) {
      uVar7 = uVar5 + 1;
      uVar6 = (uVar5 * uVar5 + sVar4) % uVar6;
      uVar5 = uVar6 / this->local_capacity_;
      pGVar1 = (this->hash_table_).
               super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity = 0;
      local_88.field_2._12_4_ = 0;
      src.ptr = (size_t)&local_88;
      src.rank = (uVar6 % this->local_capacity_) * 0x20 + pGVar1[uVar5].ptr;
      read<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
                ((BCL *)pGVar1[uVar5].rank,src,
                 (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                  *)0x1,in_R8);
      local_58.ptr.rank = (size_t)local_88._M_dataplus._M_p;
      local_58.ptr.ptr = local_88._M_string_length;
      local_58.len = local_88.field_2._M_allocated_capacity;
      uStack_40 = CONCAT44(local_88.field_2._12_4_,local_88.field_2._8_4_);
      uVar5 = uVar7;
      if (local_88.field_2._12_4_ != 2) break;
      Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
      ::get(&local_88,&local_58);
      _Var2._M_p = local_88._M_dataplus._M_p;
      if (local_88._M_string_length == key->_M_string_length) {
        if (local_88._M_string_length == 0) {
          bVar8 = true;
        }
        else {
          iVar3 = bcmp(local_88._M_dataplus._M_p,(key->_M_dataplus)._M_p,local_88._M_string_length);
          bVar8 = iVar3 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_88.field_2) {
        operator_delete(_Var2._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      uVar6 = this->capacity_;
      if (uVar6 <= uVar7 || bVar8) {
        if (bVar8) {
          *local_60 = (uint)uStack_40;
        }
        return bVar8;
      }
    }
    if (local_88.field_2._12_4_ == 0) {
      return false;
    }
    uVar6 = this->capacity_;
  } while (uVar7 < uVar6);
  return false;
}

Assistant:

bool find_nonatomic_impl_(const Key &key, T &val) {
    size_t hash = hash_fn_(key);
    size_type probe = 0;
    bool success = false;
    HME entry;
    int status;
    do {
      size_type slot = (hash + get_probe(probe++)) % capacity();
      entry = get_entry(slot);
      status = entry.used;
      if (status == ready_flag) {
        success = (entry.get_key() == key);
      }
    } while (!success && status != free_flag && probe < capacity());
    if (success) {
      val = entry.get_val();
      return true;
    } else {
      return false;
    }
  }